

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int ARKodeSetErrorBias(void *arkode_mem,sunrealtype bias)

{
  int iVar1;
  int line;
  int error_code;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem local_28;
  ARKodeHAdaptMem local_20;
  double local_18;
  
  local_18 = bias;
  iVar1 = arkAccessHAdaptMem(arkode_mem,"ARKodeSetErrorBias",&local_28,&local_20);
  if (iVar1 == 0) {
    if (local_28->step_supports_adaptive == 0) {
      msgfmt = "time-stepping module does not support temporal adaptivity";
      iVar1 = -0x30;
      error_code = -0x30;
      line = 0x6f1;
    }
    else if (local_28->hadapt_mem->hcontroller == (SUNAdaptController)0x0) {
      msgfmt = "SUNAdaptController NULL -- must be set before setting the error bias";
      iVar1 = -0x15;
      error_code = -0x15;
      line = 0x6f9;
    }
    else {
      iVar1 = SUNAdaptController_SetErrorBias
                        (~-(ulong)(local_18 < 1.0) & (ulong)local_18 |
                         -(ulong)(local_18 < 1.0) & 0xbff0000000000000,local_20->hcontroller);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "SUNAdaptController_SetErrorBias failure";
      iVar1 = -0x2f;
      error_code = -0x2f;
      line = 0x709;
    }
    arkProcessError(local_28,error_code,line,"ARKodeSetErrorBias",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,msgfmt);
  }
  return iVar1;
}

Assistant:

int ARKodeSetErrorBias(void* arkode_mem, sunrealtype bias)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Return an error if there is not a current SUNAdaptController */
  if (ark_mem->hadapt_mem->hcontroller == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__,
                    __FILE__, "SUNAdaptController NULL -- must be set before setting the error bias");
    return (ARK_MEM_NULL);
  }

  /* set allowed value, otherwise set default */
  if (bias < ONE)
  {
    retval = SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller, -ONE);
  }
  else
  {
    retval = SUNAdaptController_SetErrorBias(hadapt_mem->hcontroller, bias);
  }
  if (retval != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__, __FILE__,
                    "SUNAdaptController_SetErrorBias failure");
    return (ARK_CONTROLLER_ERR);
  }
  return (ARK_SUCCESS);
}